

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O1

bool __thiscall ON_BrepRegionTopology::Read(ON_BrepRegionTopology *this,ON_BinaryArchive *file)

{
  ON_BrepFaceSide *pOVar1;
  ON_BrepRegion *pOVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int major_version;
  int minor_version;
  int local_28 [2];
  
  bVar4 = false;
  local_28[0] = 0;
  local_28[1] = 0;
  bVar3 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_28,local_28 + 1);
  if (bVar3) {
    bVar3 = local_28[0] == 1;
    if (bVar3) {
      bVar3 = ON_BrepFaceSideArray::Read(&this->m_FS,file);
      lVar5 = (long)(this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
                    super_ON_ClassArray<ON_BrepFaceSide>.m_count;
      if (0 < lVar5) {
        pOVar1 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.
                 super_ON_ClassArray<ON_BrepFaceSide>.m_a;
        lVar6 = 0;
        do {
          *(ON_BrepRegionTopology **)((long)&pOVar1->m_rtop + lVar6) = this;
          lVar6 = lVar6 + 0x30;
        } while (lVar5 * 0x30 != lVar6);
      }
      if (bVar3) {
        bVar3 = ON_BrepRegionArray::Read(&this->m_R,file);
        lVar5 = (long)(this->m_R).super_ON_ObjectArray<ON_BrepRegion>.
                      super_ON_ClassArray<ON_BrepRegion>.m_count;
        if (0 < lVar5) {
          pOVar2 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.
                   super_ON_ClassArray<ON_BrepRegion>.m_a;
          lVar6 = 0;
          do {
            *(ON_BrepRegionTopology **)((long)&pOVar2->m_rtop + lVar6) = this;
            lVar6 = lVar6 + 0x78;
          } while (lVar5 * 0x78 - lVar6 != 0);
        }
      }
    }
    bVar4 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar4 = (bool)(bVar4 & bVar3);
  }
  return bVar4;
}

Assistant:

bool ON_BrepRegionTopology::Read( ON_BinaryArchive& file )
{
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;
  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = m_FS.Read(file);
    for ( i = 0; i < m_FS.Count(); i++ )
      m_FS[i].m_rtop = this;
    if (!rc) break;

    rc = m_R.Read(file);
    for ( i = 0; i < m_R.Count(); i++ )
      m_R[i].m_rtop = this;
    if (!rc) break;

    break;
  }
  if ( !file.EndRead3dmChunk() )
    rc = false;
  return rc;
}